

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRErrorCorrectionLevel.cpp
# Opt level: O0

ErrorCorrectionLevel ZXing::QRCode::ECLevelFromString(char *str)

{
  char *str_local;
  ErrorCorrectionLevel local_4;
  
  switch(*str) {
  case 'H':
    local_4 = High;
    break;
  default:
    local_4 = Invalid;
    break;
  case 'L':
    local_4 = Low;
    break;
  case 'M':
    local_4 = Medium;
    break;
  case 'Q':
    local_4 = Quality;
  }
  return local_4;
}

Assistant:

ErrorCorrectionLevel ECLevelFromString(const char* str)
{
	switch (str[0]) {
	case 'L': return ErrorCorrectionLevel::Low;
	case 'M': return ErrorCorrectionLevel::Medium;
	case 'Q': return ErrorCorrectionLevel::Quality;
	case 'H': return ErrorCorrectionLevel::High;
	default:  return ErrorCorrectionLevel::Invalid;
	}
}